

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void cf_socket_active(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  cf->conn->sock[cf->sockindex] = *(curl_socket_t *)((long)pvVar1 + 0x98);
  set_local_ip(cf,data);
  if (cf->sockindex == 0) {
    memcpy(&cf->conn->primary,(void *)((long)pvVar1 + 0x9c),100);
    cf->conn->remote_addr = (Curl_sockaddr_ex *)((long)pvVar1 + 8);
    cf->conn->bits =
         (ConnectBits)
         ((ulong)cf->conn->bits & 0xfffffffffffff7ff |
         (ulong)(*(int *)((long)pvVar1 + 8) == 10) << 0xb);
  }
  else {
    memcpy(&cf->conn->secondary,(void *)((long)pvVar1 + 0x9c),100);
  }
  *(byte *)((long)pvVar1 + 0x134) = *(byte *)((long)pvVar1 + 0x134) & 0xef | 0x10;
  return;
}

Assistant:

static void cf_socket_active(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  /* use this socket from now on */
  cf->conn->sock[cf->sockindex] = ctx->sock;
  set_local_ip(cf, data);
  if(cf->sockindex == FIRSTSOCKET) {
    cf->conn->primary = ctx->ip;
    cf->conn->remote_addr = &ctx->addr;
  #ifdef USE_IPV6
    cf->conn->bits.ipv6 = (ctx->addr.family == AF_INET6);
  #endif
  }
  else {
    cf->conn->secondary = ctx->ip;
  }
  ctx->active = TRUE;
}